

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Plugins.cpp
# Opt level: O2

optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_> *
__thiscall
Vault::Sys::Plugins::reg
          (optional<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,Plugins *this,Path *type,Path *name,Parameters *parameters)

{
  Client *client;
  string local_b0;
  Path local_90;
  Url local_70;
  string local_50;
  
  client = *(Client **)this;
  Vault::operator+(&local_50,type,"/");
  Vault::operator+(&local_b0,&local_50,name);
  local_90.value_._M_dataplus._M_p = (pointer)&local_90.value_.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p == &local_b0.field_2) {
    local_90.value_.field_2._8_8_ = local_b0.field_2._8_8_;
  }
  else {
    local_90.value_._M_dataplus._M_p = local_b0._M_dataplus._M_p;
  }
  local_90.value_._M_string_length = local_b0._M_string_length;
  local_b0._M_string_length = 0;
  local_b0.field_2._M_local_buf[0] = '\0';
  local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
  getUrl(&local_70,this,&local_90);
  HttpConsumer::put(__return_storage_ptr__,client,&local_70,parameters);
  std::__cxx11::string::~string((string *)&local_70);
  std::__cxx11::string::~string((string *)&local_90);
  std::__cxx11::string::~string((string *)&local_b0);
  std::__cxx11::string::~string((string *)&local_50);
  return __return_storage_ptr__;
}

Assistant:

std::optional<std::string>
Vault::Sys::Plugins::reg(const Path &type, const Path &name,
                         const Parameters &parameters) {
  return HttpConsumer::put(client_, getUrl(Path{type + "/" + name}),
                           parameters);
}